

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManIsoStrashReduce2(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  Vec_Wec_t *vSupps_00;
  Gia_Man_t *pGVar1;
  Gia_Man_t *pNew;
  Vec_Wec_t *vSupps;
  Vec_Int_t *vCoMap;
  Vec_Ptr_t **ppVStack_18;
  int fVerbose_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Gia_Man_t *p_local;
  
  vCoMap._4_4_ = fVerbose;
  ppVStack_18 = pvPosEquivs;
  pvPosEquivs_local = (Vec_Ptr_t **)p;
  vSupps_00 = Gia_ManCreateCoSupps(p,fVerbose);
  pGVar1 = Gia_ManDupStrashReduce((Gia_Man_t *)pvPosEquivs_local,vSupps_00,(Vec_Int_t **)&vSupps);
  Vec_IntFree((Vec_Int_t *)vSupps);
  Vec_WecFree(vSupps_00);
  *ppVStack_18 = (Vec_Ptr_t *)0x0;
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce2( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Int_t * vCoMap;
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Gia_Man_t * pNew = Gia_ManDupStrashReduce( p, vSupps, &vCoMap );
    Vec_IntFree( vCoMap );
    Vec_WecFree( vSupps );
    *pvPosEquivs = NULL;
    return pNew;
}